

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

SSL_SESSION * d2i_SSL_SESSION(SSL_SESSION **a,uchar **pp,long length)

{
  bool bVar1;
  SSL_SESSION *pSVar2;
  uint8_t *puVar3;
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_40;
  UniquePtr<SSL_SESSION> ret;
  CBS cbs;
  long length_local;
  uint8_t **pp_local;
  SSL_SESSION **a_local;
  
  if (length < 0) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x339);
    a_local = (SSL_SESSION **)0x0;
  }
  else {
    CBS_init((CBS *)&ret,*pp,length);
    bssl::SSL_SESSION_parse
              ((bssl *)&local_40,(CBS *)&ret,(SSL_X509_METHOD *)bssl::ssl_crypto_x509_method,
               (CRYPTO_BUFFER_POOL *)0x0);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40);
    if (bVar1) {
      if (a != (SSL_SESSION **)0x0) {
        SSL_SESSION_free(*a);
        pSVar2 = (SSL_SESSION *)
                 std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get(&local_40);
        *a = pSVar2;
      }
      puVar3 = CBS_data((CBS *)&ret);
      *pp = puVar3;
      a_local = (SSL_SESSION **)
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release(&local_40);
    }
    else {
      a_local = (SSL_SESSION **)0x0;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_40);
  }
  return (SSL_SESSION *)a_local;
}

Assistant:

SSL_SESSION *d2i_SSL_SESSION(SSL_SESSION **a, const uint8_t **pp, long length) {
  if (length < 0) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *pp, length);

  UniquePtr<SSL_SESSION> ret = SSL_SESSION_parse(&cbs, &ssl_crypto_x509_method,
                                                 NULL /* no buffer pool */);
  if (!ret) {
    return NULL;
  }

  if (a) {
    SSL_SESSION_free(*a);
    *a = ret.get();
  }
  *pp = CBS_data(&cbs);
  return ret.release();
}